

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void random_field_element_magnitude(secp256k1_fe *fe)

{
  uint32_t uVar1;
  long in_RDI;
  int n;
  secp256k1_fe zero;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  
  uVar1 = secp256k1_testrand_int(in_stack_ffffffffffffffc4);
  secp256k1_fe_normalize((secp256k1_fe *)0x13e931);
  if (uVar1 != 0) {
    secp256k1_fe_clear((secp256k1_fe *)0x13e947);
    secp256k1_fe_negate_unchecked
              ((secp256k1_fe *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    secp256k1_fe_mul_int_unchecked
              ((secp256k1_fe *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    secp256k1_fe_add((secp256k1_fe *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                     (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (*(uint32_t *)(in_RDI + 0x28) != uVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x68,"test condition failed: fe->magnitude == n");
      abort();
    }
  }
  return;
}

Assistant:

static void random_field_element_magnitude(secp256k1_fe *fe) {
    secp256k1_fe zero;
    int n = secp256k1_testrand_int(9);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_clear(&zero);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}